

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_issue1923_vertex_color_Test_Test::TestBody
          (utObjImportExport_issue1923_vertex_color_Test_Test *this)

{
  aiScene *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  SceneDiffer differ;
  Message local_b8;
  void *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  aiScene *sceneReImport;
  Message local_88;
  void *local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  aiExportDataBlob *blob;
  Exporter exporter;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utObjImportExport_issue1923_vertex_color_Test_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/cube_with_vertexcolors_uni.obj"
                        ,0x400);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exporter,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x111,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exporter,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exporter);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_20 = Assimp::Importer::GetOrphanedScene((Importer *)&scene);
  Assimp::Exporter::Exporter((Exporter *)&blob);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Exporter::ExportToBlob((Exporter *)&blob,local_20,"obj",0,(ExportProperties *)0x0);
  local_80 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiExportDataBlob_const*>
            ((internal *)local_78,"nullptr","blob",&local_80,
             (aiExportDataBlob **)&gtest_ar_1.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sceneReImport,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sceneReImport,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sceneReImport);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Importer::ReadFileFromMemory
                 ((Importer *)&scene,(void *)(gtest_ar_1.message_.ptr_)->_M_string_length,
                  *(size_t *)gtest_ar_1.message_.ptr_,0x400,"");
  local_b0 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_a8,"nullptr","scene",&local_b0,&local_20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x11b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  Assimp::SceneDiffer::SceneDiffer((SceneDiffer *)&gtest_ar_.message_);
  local_e9 = Assimp::SceneDiffer::isEqual
                       ((SceneDiffer *)&gtest_ar_.message_,local_20,
                        (aiScene *)gtest_ar_2.message_.ptr_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_e8,
               (AssertionResult *)"differ.isEqual( scene, sceneReImport )","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  paVar1 = local_20;
  if (local_20 != (aiScene *)0x0) {
    aiScene::~aiScene(local_20);
    operator_delete(paVar1);
  }
  Assimp::SceneDiffer::~SceneDiffer((SceneDiffer *)&gtest_ar_.message_);
  Assimp::Exporter::~Exporter((Exporter *)&blob);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F( utObjImportExport, issue1923_vertex_color_Test ) {
    ::Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/cube_with_vertexcolors_uni.obj", aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );

    scene = importer.GetOrphanedScene();

#ifndef ASSIMP_BUILD_NO_EXPORT
    ::Assimp::Exporter exporter;
    const aiExportDataBlob* blob = exporter.ExportToBlob( scene, "obj");
    EXPECT_NE( nullptr, blob );

    const aiScene *sceneReImport = importer.ReadFileFromMemory( blob->data, blob->size, aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( scene, sceneReImport ) );
#endif // ASSIMP_BUILD_NO_EXPORT

    delete scene;
}